

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__declare
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  bool bVar1;
  ENUM__mathml__declare__occurrence EVar2;
  uint64 uVar3;
  long *in_RSI;
  ParserTemplateBase *in_RDI;
  bool failed_2;
  bool failed_1;
  bool failed;
  ParserChar *attributeValue;
  StringHash hash;
  ParserChar *attribute;
  ParserChar **attributeArray;
  declare__AttributeData *attributeData;
  URI *in_stack_fffffffffffffda8;
  URI *other;
  URI *in_stack_fffffffffffffdb0;
  void **in_stack_fffffffffffffdb8;
  pair<unsigned_long,_COLLADASaxFWL15::ENUM__mathml__declare__occurrence> *in_stack_fffffffffffffdc8
  ;
  bool *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  undefined8 in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea0;
  StringHash in_stack_fffffffffffffea8;
  ErrorType in_stack_fffffffffffffeb0;
  Severity in_stack_fffffffffffffeb4;
  ParserTemplateBase *in_stack_fffffffffffffeb8;
  URI local_140;
  byte local_53;
  byte local_52;
  byte local_51;
  ParserChar *local_50;
  StringHash local_48;
  ParserChar *local_40;
  undefined8 *local_38;
  declare__AttributeData *local_30;
  long *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  local_30 = GeneratedSaxParser::ParserTemplateBase::
             newData<COLLADASaxFWL15::declare__AttributeData>(in_RDI,in_stack_fffffffffffffdb8);
  local_38 = (undefined8 *)*local_18;
  if (local_38 == (undefined8 *)0x0) {
LAB_00a489a5:
    if ((local_30->present_attributes & 2) == 0) {
      other = (URI *)&stack0xfffffffffffffdc8;
      COLLADABU::URI::URI((URI *)in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8);
      COLLADABU::URI::operator=(in_stack_fffffffffffffdb0,other);
      COLLADABU::URI::~URI(in_stack_fffffffffffffdb0);
    }
    local_1 = true;
  }
  else {
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  local_40 = (ParserChar *)*local_38;
                  if (local_40 == (ParserChar *)0x0) {
                    local_40 = (ParserChar *)0x0;
                    goto LAB_00a489a5;
                  }
                  local_48 = GeneratedSaxParser::Utils::calculateStringHash(local_40);
                  if (local_38 + 1 == (undefined8 *)0x0) {
                    return false;
                  }
                  local_50 = (ParserChar *)local_38[1];
                  local_38 = local_38 + 2;
                  if (local_48 != 0x7c065) break;
                  local_30->type = local_50;
                }
                if (local_48 != 0x593f0c) break;
                in_stack_fffffffffffffdb0 = &local_140;
                GeneratedSaxParser::Utils::toURI
                          ((ParserChar **)
                           CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                           in_stack_fffffffffffffdd0);
                COLLADABU::URI::operator=(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
                COLLADABU::URI::~URI(in_stack_fffffffffffffdb0);
                if (((local_53 & 1) != 0) &&
                   (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                      ((ParserTemplateBase *)in_stack_fffffffffffffde0,
                                       in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8,
                                       (StringHash)in_stack_fffffffffffffdd0,
                                       (StringHash)in_stack_fffffffffffffdc8,(ParserChar *)in_RDI),
                   bVar1)) {
                  return false;
                }
                if ((local_53 & 1) == 0) {
                  local_30->present_attributes = local_30->present_attributes | 2;
                }
              }
              if (local_48 != 0x7488e3) break;
              uVar3 = GeneratedSaxParser::Utils::toUint64
                                ((ParserChar *)in_stack_fffffffffffffdb0,
                                 (bool *)in_stack_fffffffffffffda8);
              local_30->nargs = uVar3;
              if (((local_51 & 1) != 0) &&
                 (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                    ((ParserTemplateBase *)in_stack_fffffffffffffde0,
                                     in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8,
                                     (StringHash)in_stack_fffffffffffffdd0,
                                     (StringHash)in_stack_fffffffffffffdc8,(ParserChar *)in_RDI),
                 bVar1)) {
                return false;
              }
              if ((local_51 & 1) == 0) {
                local_30->present_attributes = local_30->present_attributes | 1;
              }
            }
            if (local_48 != 0x79a665) break;
            local_30->scope = local_50;
          }
          if (local_48 != 0x4a5aa87) break;
          local_30->encoding = local_50;
        }
        if (local_48 == 0xc9ffd35) break;
        bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                          (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                           in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                           (ParserChar *)in_stack_fffffffffffffea0,
                           (ParserChar *)in_stack_fffffffffffffe98);
        if (bVar1) {
          return false;
        }
      }
      EVar2 = GeneratedSaxParser::Utils::
              toEnum<COLLADASaxFWL15::ENUM__mathml__declare__occurrence,_unsigned_long,_(COLLADASaxFWL15::ENUM__mathml__declare__occurrence)3>
                        ((ParserChar *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)
                         ,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                         (_func_unsigned_long_ParserChar_ptr_bool_ptr *)in_RDI);
      local_30->occurrence = EVar2;
    } while (((local_52 & 1) == 0) ||
            (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                               ((ParserTemplateBase *)in_stack_fffffffffffffde0,
                                in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8,
                                (StringHash)in_stack_fffffffffffffdd0,
                                (StringHash)in_stack_fffffffffffffdc8,(ParserChar *)in_RDI), !bVar1)
            );
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__declare( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__declare( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

declare__AttributeData* attributeData = newData<declare__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_TYPE:
    {

attributeData->type = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_SCOPE:
    {

attributeData->scope = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_NARGS:
    {
bool failed;
attributeData->nargs = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_DECLARE,
        HASH_ATTRIBUTE_NARGS,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= declare__AttributeData::ATTRIBUTE_NARGS_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_OCCURRENCE:
    {
bool failed;
attributeData->occurrence = Utils::toEnum<ENUM__mathml__declare__occurrence, StringHash, ENUM__mathml__declare__occurrence__COUNT>(attributeValue, failed, ENUM__mathml__declare__occurrenceMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_DECLARE,
        HASH_ATTRIBUTE_OCCURRENCE,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_ENCODING:
    {

attributeData->encoding = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_DEFINITIONURL:
    {
bool failed;
attributeData->definitionURL = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_DECLARE,
        HASH_ATTRIBUTE_DEFINITIONURL,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= declare__AttributeData::ATTRIBUTE_DEFINITIONURL_PRESENT;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_DECLARE, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ((attributeData->present_attributes & declare__AttributeData::ATTRIBUTE_DEFINITIONURL_PRESENT) == 0)
{
    attributeData->definitionURL = COLLADABU::URI("");
}


    return true;
}